

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void display_ego_item(wchar_t col,wchar_t row,_Bool cursor,wchar_t oid)

{
  ego_item *peVar1;
  wchar_t wVar2;
  uint8_t attr;
  ego_item *ego;
  wchar_t oid_local;
  _Bool cursor_local;
  wchar_t row_local;
  wchar_t col_local;
  
  peVar1 = e_info;
  wVar2 = default_item_id(oid);
  c_prt(curs_attrs[(int)(uint)((peVar1[wVar2].everseen & 1U) != 0)][(int)(uint)cursor],
        peVar1[wVar2].name,row,col);
  return;
}

Assistant:

static void display_ego_item(int col, int row, bool cursor, int oid)
{
	/* Access the object */
	struct ego_item *ego = &e_info[default_item_id(oid)];

	/* Choose a color */
	uint8_t attr = curs_attrs[0 != (int)ego->everseen][0 != (int)cursor];

	/* Display the name */
	c_prt(attr, ego->name, row, col);
}